

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O1

int rops_pt_init_destroy_h2
              (lws_context *context,lws_context_creation_info *info,lws_context_per_thread *pt,
              int destroy)

{
  (context->set).s[4] = 0;
  (context->set).s[5] = 0x4000;
  (context->set).s[6] = 0x1000;
  (context->set).s[7] = 0;
  (context->set).s[0] = 1;
  (context->set).s[1] = 0x10000;
  (context->set).s[2] = 0;
  (context->set).s[3] = 0x18;
  (context->set).s[8] = 1;
  return 0;
}

Assistant:

int
rops_pt_init_destroy_h2(struct lws_context *context,
		    const struct lws_context_creation_info *info,
		    struct lws_context_per_thread *pt, int destroy)
{
	context->set = lws_h2_stock_settings;

	/*
	 * We only want to do this once... we will do it if we are built
	 * otherwise h1 ops will do it (or nobody if no http at all)
	 */
#if !defined(LWS_ROLE_H2) && defined(LWS_WITH_SERVER)
	if (!destroy) {

		pt->sul_ah_lifecheck.cb = lws_sul_http_ah_lifecheck;

		__lws_sul_insert(&pt->pt_sul_owner, &pt->sul_ah_lifecheck,
				 30 * LWS_US_PER_SEC);
	} else
		lws_dll2_remove(&pt->sul_ah_lifecheck.list);
#endif

	return 0;
}